

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O2

xmlCatalogEntryPtr
xmlNewCatalogEntry(xmlCatalogEntryType type,xmlChar *name,xmlChar *value,xmlChar *URL,
                  xmlCatalogPrefer prefer,xmlCatalogEntryPtr group)

{
  xmlCatalogEntryPtr pxVar1;
  xmlChar *pxVar2;
  xmlChar *pxVar3;
  xmlChar *pxVar4;
  
  pxVar1 = (xmlCatalogEntryPtr)(*xmlMalloc)(0x50);
  if (pxVar1 == (xmlCatalogEntryPtr)0x0) {
    xmlCatalogErrMemory();
    return (xmlCatalogEntryPtr)0x0;
  }
  pxVar1->children = (_xmlCatalogEntry *)0x0;
  pxVar1->next = (_xmlCatalogEntry *)0x0;
  pxVar1->parent = (_xmlCatalogEntry *)0x0;
  pxVar1->type = type;
  if (((type == XML_CATA_DELEGATE_PUBLIC) || (type == XML_CATA_PUBLIC)) &&
     (pxVar2 = xmlCatalogNormalizePublic(name), pxVar2 != (xmlChar *)0x0)) {
    pxVar4 = pxVar2;
    if (*pxVar2 == '\0') {
      pxVar3 = (xmlChar *)0x0;
      goto LAB_0015b94f;
    }
  }
  else {
    pxVar4 = (xmlChar *)0x0;
    pxVar3 = (xmlChar *)0x0;
    pxVar2 = name;
    if (name == (xmlChar *)0x0) goto LAB_0015b94f;
  }
  pxVar3 = xmlStrdup(pxVar2);
LAB_0015b94f:
  pxVar1->name = pxVar3;
  if (pxVar4 != (xmlChar *)0x0) {
    (*xmlFree)(pxVar4);
  }
  if (value == (xmlChar *)0x0) {
    pxVar2 = (xmlChar *)0x0;
  }
  else {
    pxVar2 = xmlStrdup(value);
  }
  pxVar1->value = pxVar2;
  if (URL != (xmlChar *)0x0) {
    value = URL;
  }
  if (value == (xmlChar *)0x0) {
    pxVar2 = (xmlChar *)0x0;
  }
  else {
    pxVar2 = xmlStrdup(value);
  }
  pxVar1->URL = pxVar2;
  pxVar1->prefer = prefer;
  pxVar1->dealloc = 0;
  pxVar1->depth = 0;
  pxVar1->group = group;
  return pxVar1;
}

Assistant:

static xmlCatalogEntryPtr
xmlNewCatalogEntry(xmlCatalogEntryType type, const xmlChar *name,
	   const xmlChar *value, const xmlChar *URL, xmlCatalogPrefer prefer,
	   xmlCatalogEntryPtr group) {
    xmlCatalogEntryPtr ret;
    xmlChar *normid = NULL;

    ret = (xmlCatalogEntryPtr) xmlMalloc(sizeof(xmlCatalogEntry));
    if (ret == NULL) {
        xmlCatalogErrMemory();
	return(NULL);
    }
    ret->next = NULL;
    ret->parent = NULL;
    ret->children = NULL;
    ret->type = type;
    if (type == XML_CATA_PUBLIC || type == XML_CATA_DELEGATE_PUBLIC) {
        normid = xmlCatalogNormalizePublic(name);
        if (normid != NULL)
            name = (*normid != 0 ? normid : NULL);
    }
    if (name != NULL)
	ret->name = xmlStrdup(name);
    else
	ret->name = NULL;
    if (normid != NULL)
        xmlFree(normid);
    if (value != NULL)
	ret->value = xmlStrdup(value);
    else
	ret->value = NULL;
    if (URL == NULL)
	URL = value;
    if (URL != NULL)
	ret->URL = xmlStrdup(URL);
    else
	ret->URL = NULL;
    ret->prefer = prefer;
    ret->dealloc = 0;
    ret->depth = 0;
    ret->group = group;
    return(ret);
}